

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::reserve
          (vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *this,
          size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar13;
  ulong uVar14;
  LightBounds *pLVar12;
  
  if (this->nAlloc < n) {
    if (n * 0x34 == 0) {
      pLVar12 = (LightBounds *)0x0;
    }
    else {
      pmVar3 = (this->alloc).memoryResource;
      iVar11 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n * 0x34,4);
      pLVar12 = (LightBounds *)CONCAT44(extraout_var,iVar11);
    }
    if (this->nStored != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&(this->ptr->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar13);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        puVar1 = (undefined8 *)
                 ((long)&(this->ptr->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar13);
        uVar8 = puVar1[1];
        uVar9 = puVar1[2];
        uVar10 = puVar1[3];
        puVar2 = (undefined8 *)
                 ((long)&(pLVar12->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar2[2] = uVar9;
        puVar2[3] = uVar10;
        puVar1 = (undefined8 *)
                 ((long)&(pLVar12->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar13);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        puVar1[2] = uVar6;
        puVar1[3] = uVar7;
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x34;
      } while (uVar14 < this->nStored);
    }
    if (this->ptr != (LightBounds *)0x0) {
      pmVar3 = (this->alloc).memoryResource;
      (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc * 0x34,4);
    }
    this->nAlloc = n;
    this->ptr = pLVar12;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }